

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseTypeModuleField(WastParser *this,Module *module)

{
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var1;
  TypeEntry *pTVar2;
  undefined8 uVar3;
  bool bVar4;
  Result RVar5;
  TypeModuleField *pTVar6;
  TypeEntry *pTVar7;
  Result RVar8;
  long *plVar9;
  long lVar10;
  string name;
  Location loc;
  BindingHash bindings;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_130;
  string local_128;
  __node_base_ptr *local_108;
  char *pcStack_100;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_d8;
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_e8,this);
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)local_d8.field_1.offset;
  local_88._M_element_count = local_d8._8_8_;
  local_88._M_buckets = (__buckets_ptr)local_e8._0_8_;
  local_88._M_bucket_count = local_e8._8_8_;
  pTVar6 = (TypeModuleField *)operator_new(0x48);
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.filename._M_len =
       (size_t)local_88._M_buckets;
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.filename._M_str =
       (char *)local_88._M_bucket_count;
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.field_1.field_1.
  offset = (size_t)local_88._M_before_begin._M_nxt;
  *(size_type *)
   ((long)&(pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.field_1
   + 8) = local_88._M_element_count;
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.type_ = Type;
  (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__TypeModuleField_001a0148;
  (pTVar6->type)._M_t.super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)0x0;
  RVar5 = Expect(this,Type);
  RVar8.enum_ = Error;
  if (RVar5.enum_ == Error) goto LAB_0013abb2;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_128);
  RVar5 = Expect(this,Lpar);
  RVar8.enum_ = Error;
  if (RVar5.enum_ != Error) {
    GetToken((Token *)local_e8,this);
    local_f8.offset = (size_t)local_d8.field_1.offset;
    uStack_f0 = local_d8._8_8_;
    local_108 = (__node_base_ptr *)local_e8._0_8_;
    pcStack_100 = (char *)local_e8._8_8_;
    bVar4 = Match(this,First_RefKind);
    if (bVar4) {
      pTVar7 = (TypeEntry *)operator_new(0x88);
      pTVar7->_vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_001a0218;
      (pTVar7->loc).filename._M_len = 0;
      (pTVar7->loc).filename._M_str = (char *)0x0;
      *(undefined8 *)((long)&(pTVar7->loc).filename._M_str + 4) = 0;
      *(undefined8 *)((long)&(pTVar7->loc).field_1.field_1.offset + 4) = 0;
      (pTVar7->name)._M_dataplus._M_p = (pointer)&(pTVar7->name).field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&pTVar7->name,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      pTVar7->kind_ = Func;
      pTVar7->_vptr_TypeEntry = (_func_int **)&PTR__FuncType_001a01d0;
      pTVar7[1]._vptr_TypeEntry = (_func_int **)0x0;
      pTVar7[1].loc.filename._M_len = 0;
      pTVar7[1].loc.filename._M_str = (char *)0x0;
      pTVar7[1].loc.field_1.field_1.offset = 0;
      *(undefined8 *)((long)&pTVar7[1].loc.field_1 + 8) = 0;
      pTVar7[1].name._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&pTVar7[1].name._M_string_length = 0;
      local_88._M_buckets = &local_88._M_single_bucket;
      local_88._M_bucket_count = 1;
      local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_88._M_element_count = 0;
      local_88._M_rehash_policy._M_max_load_factor = 1.0;
      local_88._M_rehash_policy._M_next_resize = 0;
      local_88._M_single_bucket = (__node_base_ptr)0x0;
      RVar5 = ParseFuncSignature(this,(FuncSignature *)(pTVar7 + 1),(BindingHash *)&local_88);
      if (RVar5.enum_ != Error) {
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"param","");
        plVar9 = local_b8;
        local_c8[0] = plVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"result","");
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   (string *)local_e8,local_a8);
        bVar4 = Match(this,Lpar);
        if (bVar4) {
          RVar5 = ErrorExpected(this,&local_48,(char *)0x0);
          bVar4 = RVar5.enum_ == Error;
        }
        else {
          bVar4 = false;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        lVar10 = -0x40;
        do {
          if (plVar9 != (long *)plVar9[-2]) {
            operator_delete((long *)plVar9[-2],*plVar9 + 1);
          }
          plVar9 = plVar9 + -4;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0);
        if (!bVar4) {
          pTVar2 = (pTVar6->type)._M_t.
                   super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
                   super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
          (pTVar6->type)._M_t.
          super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
          super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = pTVar7;
          if (pTVar2 != (TypeEntry *)0x0) {
            (*pTVar2->_vptr_TypeEntry[1])();
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::~_Hashtable(&local_88);
          goto LAB_0013acd1;
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::~_Hashtable(&local_88);
LAB_0013ab61:
      (*pTVar7->_vptr_TypeEntry[1])(pTVar7);
LAB_0013ab91:
      RVar8.enum_ = Error;
    }
    else {
      bVar4 = Match(this,Struct);
      if (bVar4) {
        if ((this->options_->features).gc_enabled_ == false) {
          Error(this,0x17cbcc);
          goto LAB_0013ab91;
        }
        pTVar7 = (TypeEntry *)operator_new(0x68);
        (pTVar7->loc).filename._M_len = 0;
        (pTVar7->loc).filename._M_str = (char *)0x0;
        *(undefined8 *)((long)&(pTVar7->loc).filename._M_str + 4) = 0;
        *(undefined8 *)((long)&(pTVar7->loc).field_1.field_1.offset + 4) = 0;
        (pTVar7->name)._M_dataplus._M_p = (pointer)&(pTVar7->name).field_2;
        (pTVar7->name)._M_string_length = 0;
        (pTVar7->name).field_2._M_local_buf[0] = '\0';
        pTVar7->kind_ = Struct;
        pTVar7->_vptr_TypeEntry = (_func_int **)&PTR__StructType_001a0b58;
        pTVar7[1]._vptr_TypeEntry = (_func_int **)0x0;
        pTVar7[1].loc.filename._M_len = 0;
        pTVar7[1].loc.filename._M_str = (char *)0x0;
        RVar5 = ParseFieldList(this,(vector<wabt::Field,_std::allocator<wabt::Field>_> *)
                                    (pTVar7 + 1));
        if (RVar5.enum_ == Error) goto LAB_0013ab61;
        _Var1._M_head_impl =
             (pTVar6->type)._M_t.
             super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
             super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
             super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
        (pTVar6->type)._M_t.
        super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
        super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = pTVar7;
        if (_Var1._M_head_impl != (TypeEntry *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_TypeEntry + 8))();
        }
LAB_0013acd1:
        RVar5 = Expect(this,Rpar);
        RVar8.enum_ = Error;
        if ((RVar5.enum_ != Error) && (RVar5 = Expect(this,Rpar), RVar5.enum_ != Error)) {
          local_130._M_head_impl = pTVar6;
          Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                      *)&local_130);
          if (local_130._M_head_impl != (TypeModuleField *)0x0) {
            (*((local_130._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_130._M_head_impl = (TypeModuleField *)0x0;
          pTVar6 = (TypeModuleField *)0x0;
          RVar8.enum_ = Ok;
        }
      }
      else {
        bVar4 = Match(this,Array);
        if (bVar4) {
          if ((this->options_->features).gc_enabled_ == false) {
            Error(this,0x1777cf);
          }
          std::make_unique<wabt::ArrayType,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
          RVar5 = ParseField(this,(Field *)(local_e8._0_8_ + 0x50));
          uVar3 = local_e8._0_8_;
          if (RVar5.enum_ != Error) {
            local_e8._0_8_ = (__node_base_ptr *)0x0;
            _Var1._M_head_impl =
                 (pTVar6->type)._M_t.
                 super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
                 super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
            (pTVar6->type)._M_t.
            super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
            super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)uVar3;
            if (_Var1._M_head_impl == (TypeEntry *)0x0) goto LAB_0013acd1;
            (**(code **)((long)(_Var1._M_head_impl)->_vptr_TypeEntry + 8))();
          }
          if ((__node_base_ptr *)local_e8._0_8_ != (__node_base_ptr *)0x0) {
            (*(code *)(*(__node_base_ptr *)local_e8._0_8_)[1]._M_nxt)();
          }
          RVar8.enum_ = Error;
          if (RVar5.enum_ != Error) goto LAB_0013acd1;
        }
        else {
          local_e8._0_8_ = local_e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"func","");
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"struct","");
          plVar9 = local_98;
          local_a8[0] = plVar9;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"array","");
          local_88._M_buckets = (__node_base_ptr *)0x0;
          local_88._M_bucket_count = 0;
          local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                     (string *)local_e8,&local_88);
          RVar8 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_88,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88);
          lVar10 = -0x60;
          do {
            if (plVar9 != (long *)plVar9[-2]) {
              operator_delete((long *)plVar9[-2],*plVar9 + 1);
            }
            plVar9 = plVar9 + -4;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if (pTVar6 == (TypeModuleField *)0x0) {
    return (Result)RVar8.enum_;
  }
LAB_0013abb2:
  (*(pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField._vptr_ModuleField
    [1])(pTVar6);
  return (Result)RVar8.enum_;
}

Assistant:

Result WastParser::ParseTypeModuleField(Module* module) {
  WABT_TRACE(ParseTypeModuleField);
  EXPECT(Lpar);
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  EXPECT(Type);

  std::string name;
  ParseBindVarOpt(&name);
  EXPECT(Lpar);
  Location loc = GetLocation();

  if (Match(TokenType::Func)) {
    auto func_type = std::make_unique<FuncType>(name);
    BindingHash bindings;
    CHECK_RESULT(ParseFuncSignature(&func_type->sig, &bindings));
    CHECK_RESULT(ErrorIfLpar({"param", "result"}));
    field->type = std::move(func_type);
  } else if (Match(TokenType::Struct)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "struct not allowed");
      return Result::Error;
    }
    auto struct_type = std::make_unique<StructType>(name);
    CHECK_RESULT(ParseFieldList(&struct_type->fields));
    field->type = std::move(struct_type);
  } else if (Match(TokenType::Array)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "array type not allowed");
    }
    auto array_type = std::make_unique<ArrayType>(name);
    CHECK_RESULT(ParseField(&array_type->field));
    field->type = std::move(array_type);
  } else {
    return ErrorExpected({"func", "struct", "array"});
  }

  EXPECT(Rpar);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}